

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

JsValueRef
WScriptJsrt::GetModuleNamespace
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  bool bVar1;
  LPCSTR relPath;
  char *pcVar2;
  pointer ppVar3;
  _Self local_1c0;
  allocator local_1b1;
  string local_1b0 [32];
  _Self local_190;
  iterator moduleEntry;
  undefined1 local_178 [8];
  AutoString specifierStr;
  char fullPath [260];
  char16_t *local_48;
  LPCWSTR errorMessage;
  JsValueRef returnValue;
  void *pvStack_30;
  JsErrorCode errorCode;
  void *callbackState_local;
  JsValueRef *ppvStack_20;
  unsigned_short argumentCount_local;
  JsValueRef *arguments_local;
  JsValueRef pvStack_10;
  bool isConstructCall_local;
  JsValueRef callee_local;
  
  returnValue._4_4_ = 0;
  errorMessage = (LPCWSTR)0x0;
  local_48 = L"";
  pvStack_30 = callbackState;
  callbackState_local._6_2_ = argumentCount;
  ppvStack_20 = arguments;
  arguments_local._7_1_ = isConstructCall;
  pvStack_10 = callee;
  if (argumentCount < 2) {
    returnValue._4_4_ = JsErrorInvalidArgument;
    local_48 = L"Need an argument for WScript.GetModuleNamespace";
  }
  else {
    AutoString::AutoString((AutoString *)local_178,arguments[1]);
    returnValue._4_4_ = AutoString::GetError((AutoString *)local_178);
    if (returnValue._4_4_ == JsNoError) {
      relPath = AutoString::GetString((AutoString *)local_178);
      pcVar2 = _fullpath((char *)&specifierStr.errorCode,relPath,0x104);
      if (pcVar2 == (char *)0x0) {
        returnValue._4_4_ = JsErrorInvalidArgument;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1b0,(char *)&specifierStr.errorCode,&local_1b1);
        local_190._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
             ::find(&moduleRecordMap_abi_cxx11_,(key_type *)local_1b0);
        std::__cxx11::string::~string(local_1b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
        local_1c0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
             ::end(&moduleRecordMap_abi_cxx11_);
        bVar1 = std::operator==(&local_190,&local_1c0);
        if (bVar1) {
          returnValue._4_4_ = JsErrorInvalidArgument;
          local_48 = 
          L"Need to supply a path for an already loaded module for WScript.GetModuleNamespace";
        }
        else {
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>
                   ::operator->(&local_190);
          returnValue._4_4_ = ChakraRTInterface::JsGetModuleNamespace(ppVar3->second,&errorMessage);
          if (returnValue._4_4_ == JsErrorModuleNotEvaluated) {
            local_48 = L"GetModuleNamespace called with un-evaluated module";
          }
        }
      }
    }
    AutoString::~AutoString((AutoString *)local_178);
  }
  SetExceptionIf(returnValue._4_4_,local_48);
  return errorMessage;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::GetModuleNamespace(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    JsErrorCode errorCode = JsNoError;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    LPCWSTR errorMessage = _u("");
    char fullPath[_MAX_PATH];

    if (argumentCount < 2)
    {
        errorCode = JsErrorInvalidArgument;
        errorMessage = _u("Need an argument for WScript.GetModuleNamespace");
    }
    else
    {
        AutoString specifierStr(arguments[1]);
        errorCode = specifierStr.GetError();

        if (errorCode == JsNoError)
        {
            if (_fullpath(fullPath, specifierStr.GetString(), _MAX_PATH) == nullptr)
            {
                errorCode = JsErrorInvalidArgument;
            }
            else
            {
                auto moduleEntry = moduleRecordMap.find(fullPath);
                if (moduleEntry == moduleRecordMap.end())
                {
                    errorCode = JsErrorInvalidArgument;
                    errorMessage = _u("Need to supply a path for an already loaded module for WScript.GetModuleNamespace");
                }
                else
                {
                    errorCode = ChakraRTInterface::JsGetModuleNamespace(moduleEntry->second, &returnValue);
                    if (errorCode == JsErrorModuleNotEvaluated)
                    {
                        errorMessage = _u("GetModuleNamespace called with un-evaluated module");
                    }
                }
            }
        }
    }

    SetExceptionIf(errorCode, errorMessage);
    return returnValue;
}